

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::output_context_end_message(info *this)

{
  ostream *poVar1;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38;
  reference local_18;
  context_info *context;
  info *this_local;
  
  context = (context_info *)this;
  local_18 = std::
             stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
             ::top(&this->context_stack_);
  this->indentation_ = this->indentation_ + -1;
  poVar1 = (this->super_colored_base).stm_;
  indent_abi_cxx11_(&local_38,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[4])(local_68);
  poVar1 = std::operator<<(poVar1,local_68);
  poVar1 = std::operator<<(poVar1,"end ");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_88);
  poVar1 = std::operator<<(poVar1,local_88);
  std::operator<<(poVar1,(string *)local_18);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&local_38);
  if (0 < local_18->total) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[6])();
    poVar1 = std::operator<<(poVar1,local_a8);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->total);
    std::operator<<(poVar1," total");
    std::__cxx11::string::~string(local_a8);
  }
  if (0 < local_18->skipped) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[3])();
    poVar1 = std::operator<<(poVar1,local_c8);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->skipped);
    std::operator<<(poVar1," skipped");
    std::__cxx11::string::~string(local_c8);
  }
  if (0 < local_18->failed) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
    poVar1 = std::operator<<(poVar1,local_e8);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->failed);
    std::operator<<(poVar1," failed");
    std::__cxx11::string::~string(local_e8);
  }
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])();
  poVar1 = std::operator<<(poVar1,local_108);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

void output_context_end_message() {
        const context_info& context = context_stack_.top();
        --indentation_;
        stm_
            << indent()
            << colorizer_.info()
            << "end "
            << colorizer_.reset()
            << context.desc;
        if (context.total > 0) {
          stm_
              << colorizer_.emphasize()
              << " " << context.total << " total";
        }
        if (context.skipped > 0) {
          stm_
              << colorizer_.neutral()
              << " " << context.skipped << " skipped";
        }
        if (context.failed > 0) {
          stm_
              << colorizer_.bad()
              << " " << context.failed << " failed";
        }
        stm_ << colorizer_.reset() << std::endl;
      }